

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  value_type vVar1;
  undefined1 local_50 [8];
  average<double,_4UL> filter;
  
  filter.sum._4_4_ = 0;
  vista::circular::example::average<double,_4UL>::average((average<double,_4UL> *)local_50);
  vista::circular::example::average<double,_4UL>::push((average<double,_4UL> *)local_50,11.0);
  vVar1 = vista::circular::example::average<double,_4UL>::mean((average<double,_4UL> *)local_50);
  if ((vVar1 != 11.0) || (NAN(vVar1))) {
    __assert_fail("filter.mean() == 11.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                  ,0x13,"int main()");
  }
  vista::circular::example::average<double,_4UL>::push((average<double,_4UL> *)local_50,22.0);
  vVar1 = vista::circular::example::average<double,_4UL>::mean((average<double,_4UL> *)local_50);
  if ((vVar1 != 16.5) || (NAN(vVar1))) {
    __assert_fail("filter.mean() == (11.0 + 22.0) / 2.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                  ,0x16,"int main()");
  }
  vista::circular::example::average<double,_4UL>::push((average<double,_4UL> *)local_50,33.0);
  vVar1 = vista::circular::example::average<double,_4UL>::mean((average<double,_4UL> *)local_50);
  if ((vVar1 != 22.0) || (NAN(vVar1))) {
    __assert_fail("filter.mean() == (11.0 + 22.0 + 33.0) / 3.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                  ,0x19,"int main()");
  }
  vista::circular::example::average<double,_4UL>::push((average<double,_4UL> *)local_50,44.0);
  vVar1 = vista::circular::example::average<double,_4UL>::mean((average<double,_4UL> *)local_50);
  if ((vVar1 == 27.5) && (!NAN(vVar1))) {
    vista::circular::example::average<double,_4UL>::push((average<double,_4UL> *)local_50,55.0);
    vVar1 = vista::circular::example::average<double,_4UL>::mean((average<double,_4UL> *)local_50);
    if ((vVar1 == 38.5) && (!NAN(vVar1))) {
      return 0;
    }
    __assert_fail("filter.mean() == (22.0 + 33.0 + 44.0 + 55.0) / 4.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                  ,0x1f,"int main()");
  }
  __assert_fail("filter.mean() == (11.0 + 22.0 + 33.0 + 44.0) / 4.0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                ,0x1c,"int main()");
}

Assistant:

int main()
{
    vista::circular::example::average<double, 4> filter;

    filter.push(11.0);
    assert(filter.mean() == 11.0);

    filter.push(22.0);
    assert(filter.mean() == (11.0 + 22.0) / 2.0);

    filter.push(33.0);
    assert(filter.mean() == (11.0 + 22.0 + 33.0) / 3.0);

    filter.push(44.0);
    assert(filter.mean() == (11.0 + 22.0 + 33.0 + 44.0) / 4.0);

    filter.push(55.0);
    assert(filter.mean() == (22.0 + 33.0 + 44.0 + 55.0) / 4.0);

    return 0;
}